

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cc
# Opt level: O2

int AlpnSelectCallback(SSL *ssl,uint8_t **out,uint8_t *outlen,uint8_t *in,uint inlen,void *arg)

{
  size_type sVar1;
  pointer ppVar2;
  bool bVar3;
  int iVar4;
  TestState *pTVar5;
  TestConfig *pTVar6;
  char *__ptr;
  pointer ppVar7;
  Span<const_unsigned_char> lhs;
  Span<const_unsigned_char> rhs;
  size_t sStack_40;
  
  pTVar5 = GetTestState(ssl);
  if (pTVar5->alpn_select_done == true) {
    __ptr = "AlpnSelectCallback called after completion.\n";
    sStack_40 = 0x2c;
LAB_00127aec:
    fwrite(__ptr,sStack_40,1,_stderr);
    exit(1);
  }
  pTVar5 = GetTestState(ssl);
  pTVar5->alpn_select_done = true;
  pTVar6 = GetTestConfig(ssl);
  if (pTVar6->decline_alpn == false) {
    if (pTVar6->reject_alpn == false) {
      sVar1 = (pTVar6->expect_advertised_alpn)._M_string_length;
      if ((sVar1 == 0) ||
         (lhs.size_ = sVar1, lhs.data_ = (uchar *)(pTVar6->expect_advertised_alpn)._M_dataplus._M_p,
         rhs.size_._0_4_ = inlen, rhs.data_ = in, rhs.size_._4_4_ = 0,
         bVar3 = bssl::internal::operator!=(lhs,rhs), !bVar3)) {
        if (pTVar6->defer_alps != true) {
LAB_00127aa3:
          sVar1 = (pTVar6->select_alpn)._M_string_length;
          if ((sVar1 != 0) && (pTVar6->select_empty_alpn == true)) {
            __assert_fail("config->select_alpn.empty() || !config->select_empty_alpn",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/test/test_config.cc"
                          ,0x428,
                          "int AlpnSelectCallback(SSL *, const uint8_t **, uint8_t *, const uint8_t *, unsigned int, void *)"
                         );
          }
          *out = (uint8_t *)(pTVar6->select_alpn)._M_dataplus._M_p;
          *outlen = (uint8_t)sVar1;
          return 0;
        }
        ppVar7 = (pTVar6->application_settings).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        ppVar2 = (pTVar6->application_settings).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        do {
          if (ppVar7 == ppVar2) goto LAB_00127aa3;
          iVar4 = SSL_add_application_settings
                            (ssl,(uint8_t *)(ppVar7->first)._M_dataplus._M_p,
                             (ppVar7->first)._M_string_length,
                             (uint8_t *)(ppVar7->second)._M_dataplus._M_p,
                             (ppVar7->second)._M_string_length);
          ppVar7 = ppVar7 + 1;
        } while (iVar4 != 0);
        __ptr = "error configuring ALPS.\n";
        sStack_40 = 0x18;
      }
      else {
        __ptr = "bad ALPN select callback inputs.\n";
        sStack_40 = 0x21;
      }
      goto LAB_00127aec;
    }
    iVar4 = 2;
  }
  else {
    iVar4 = 3;
  }
  return iVar4;
}

Assistant:

static int AlpnSelectCallback(SSL *ssl, const uint8_t **out, uint8_t *outlen,
                              const uint8_t *in, unsigned inlen, void *arg) {
  if (GetTestState(ssl)->alpn_select_done) {
    fprintf(stderr, "AlpnSelectCallback called after completion.\n");
    exit(1);
  }

  GetTestState(ssl)->alpn_select_done = true;

  const TestConfig *config = GetTestConfig(ssl);
  if (config->decline_alpn) {
    return SSL_TLSEXT_ERR_NOACK;
  }
  if (config->reject_alpn) {
    return SSL_TLSEXT_ERR_ALERT_FATAL;
  }

  if (!config->expect_advertised_alpn.empty() &&
      bssl::StringAsBytes(config->expect_advertised_alpn) !=
          bssl::Span(in, inlen)) {
    fprintf(stderr, "bad ALPN select callback inputs.\n");
    exit(1);
  }

  if (config->defer_alps) {
    for (const auto &pair : config->application_settings) {
      if (!SSL_add_application_settings(
              ssl, reinterpret_cast<const uint8_t *>(pair.first.data()),
              pair.first.size(),
              reinterpret_cast<const uint8_t *>(pair.second.data()),
              pair.second.size())) {
        fprintf(stderr, "error configuring ALPS.\n");
        exit(1);
      }
    }
  }

  assert(config->select_alpn.empty() || !config->select_empty_alpn);
  *out = (const uint8_t *)config->select_alpn.data();
  *outlen = config->select_alpn.size();
  return SSL_TLSEXT_ERR_OK;
}